

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

MIR_item_t_conflict
new_func(MIR_context_t ctx,char *name,size_t nres,MIR_type_t *res_types,size_t nargs,int vararg_p,
        __va_list_tag *argp)

{
  long lVar1;
  MIR_item_t_conflict pMVar2;
  undefined8 *puVar3;
  uint uVar4;
  size_t sVar5;
  undefined4 *puVar6;
  undefined8 *puVar7;
  long alStack_40 [3];
  
  lVar1 = -(nargs * 0x18 + 0xf & 0xfffffffffffffff0);
  if (nargs != 0) {
    uVar4 = argp->gp_offset;
    puVar3 = (undefined8 *)(&stack0xffffffffffffffe0 + lVar1);
    sVar5 = nargs;
    do {
      if (uVar4 < 0x29) {
        puVar6 = (undefined4 *)((ulong)uVar4 + (long)argp->reg_save_area);
        uVar4 = uVar4 + 8;
        argp->gp_offset = uVar4;
      }
      else {
        puVar6 = (undefined4 *)argp->overflow_arg_area;
        argp->overflow_arg_area = puVar6 + 2;
      }
      *(undefined4 *)(puVar3 + -1) = *puVar6;
      if (uVar4 < 0x29) {
        puVar7 = (undefined8 *)((ulong)uVar4 + (long)argp->reg_save_area);
        uVar4 = uVar4 + 8;
        argp->gp_offset = uVar4;
      }
      else {
        puVar7 = (undefined8 *)argp->overflow_arg_area;
        argp->overflow_arg_area = puVar7 + 1;
      }
      *puVar3 = *puVar7;
      puVar3 = puVar3 + 3;
      sVar5 = sVar5 - 1;
    } while (sVar5 != 0);
  }
  *(undefined1 **)((long)alStack_40 + lVar1 + 8) = &stack0xffffffffffffffd8 + lVar1;
  *(undefined8 *)((long)alStack_40 + lVar1) = 0x131d6c;
  pMVar2 = new_func_arr(ctx,name,nres,res_types,nargs,vararg_p,
                        *(MIR_var_t **)((long)alStack_40 + lVar1 + 8));
  return pMVar2;
}

Assistant:

static MIR_item_t new_func (MIR_context_t ctx, const char *name, size_t nres, MIR_type_t *res_types,
                            size_t nargs, int vararg_p, va_list argp) {
  size_t i;
  MIR_var_t *vars = alloca (sizeof (MIR_var_t) * nargs);

  for (i = 0; i < nargs; i++) {
    vars[i].type = va_arg (argp, MIR_type_t);
    vars[i].name = va_arg (argp, const char *);
  }
  return new_func_arr (ctx, name, nres, res_types, nargs, vararg_p, vars);
}